

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilist_node.h
# Opt level: O0

void __thiscall
spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
          (IntrusiveNodeBase<spvtools::opt::Instruction> *this)

{
  bool bVar1;
  IntrusiveNodeBase<spvtools::opt::Instruction> *this_local;
  
  if ((this->is_sentinel_ & 1U) != 0) {
    __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                  ,0xca,
                  "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                 );
  }
  bVar1 = IsInAList(this);
  if (!bVar1) {
    __assert_fail("this->IsInAList() && \"Cannot remove a node from a list if it is not in a list.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                  ,0xcc,
                  "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                 );
  }
  (this->next_node_->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
       this->previous_node_;
  (this->previous_node_->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ =
       this->next_node_;
  this->next_node_ = (Instruction *)0x0;
  this->previous_node_ = (Instruction *)0x0;
  return;
}

Assistant:

inline void IntrusiveNodeBase<NodeType>::RemoveFromList() {
  assert(!this->is_sentinel_ && "Sentinel nodes cannot be moved around.");
  assert(this->IsInAList() &&
         "Cannot remove a node from a list if it is not in a list.");

  this->next_node_->previous_node_ = this->previous_node_;
  this->previous_node_->next_node_ = this->next_node_;
  this->next_node_ = nullptr;
  this->previous_node_ = nullptr;
}